

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

size_t openMerkleTreeSize(size_t numNodes,uint16_t *missingLeaves,size_t missingLeavesSize,
                         picnic_instance_t *params)

{
  _Bool _Var1;
  uint *__ptr;
  size_t revealedSize;
  tree_t tree;
  size_t local_50;
  tree_t local_48;
  
  _Var1 = createTree(&local_48,(uint)numNodes,(uint)params->digest_size);
  local_50 = 0xffffffffffffffff;
  if (_Var1) {
    local_50 = 0;
    __ptr = getRevealedMerkleNodes(&local_48,missingLeaves,missingLeavesSize,&local_50);
    free(local_48.haveNodeExists);
    free(local_48.nodes);
    free(__ptr);
    local_50 = params->digest_size * local_50;
  }
  return local_50;
}

Assistant:

size_t openMerkleTreeSize(size_t numNodes, uint16_t* missingLeaves, size_t missingLeavesSize,
                          const picnic_instance_t* params) {
  tree_t tree;
  if (!createTree(&tree, numNodes, params->digest_size)) {
    return SIZE_MAX;
  }

  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(&tree, missingLeaves, missingLeavesSize, &revealedSize);

  clearTree(&tree);
  free(revealed);

  return revealedSize * params->digest_size;
}